

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
customUnits_uniquenesspermeter3_Test::~customUnits_uniquenesspermeter3_Test
          (customUnits_uniquenesspermeter3_Test *this)

{
  customUnits_uniquenesspermeter3_Test *this_local;
  
  ~customUnits_uniquenesspermeter3_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(customUnits, uniquenesspermeter3)
{
    for (std::uint16_t ii = 0; ii < 1024; ++ii) {
        auto cunit1 = precise::generate_custom_unit(ii);
        auto cunit1adj = cunit1 / precise::meter.pow(3);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.inv().base_units()),
            ii);
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1.base_units()))
            << "Error with custom unit/meter3 detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1adj.base_units()))
            << "Error with custom unit/meter3 detection of inverse " << ii;
        for (std::uint16_t jj = 0; jj < 1024; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_unit(jj);
            auto cunit2adj = cunit2 / precise::m.pow(3);
            EXPECT_FALSE(cunit1 == cunit2adj)
                << "Error with false per meter3 comparison 1 inv index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2)
                << "Error with false per meter3 comparison 2 index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2adj)
                << "Error with false per meter3 comparison 2 per meter3 index "
                << ii << "," << jj;
        }
        EXPECT_TRUE(cunit1adj * precise::m.pow(3) == cunit1)
            << "Error with true per meter3 multiply" << ii;
    }
}